

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
::sherwood_v3_table(sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
                    *this,sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
                          *other,allocator<std::pair<std::type_index,_std::any>_> *alloc)

{
  sherwood_v3_entry<std::pair<std::type_index,_std::any>_> *psVar1;
  const_iterator begin;
  
  psVar1 = empty_default_table<std::pair<std::type_index,std::any>>();
  this->entries = psVar1;
  this->num_slots_minus_one = 0;
  this->hash_policy = '?';
  this->max_lookups = '\x03';
  this->_max_load_factor = other->_max_load_factor;
  this->num_elements = 0;
  rehash_for_other_container(this,other);
  begin = sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
          ::begin(other);
  sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
  ::
  insert<ska::detailv3::sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>::templated_iterator<std::pair<std::type_index,std::any>const>>
            ((sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
              *)this,(templated_iterator<const_std::pair<std::type_index,_std::any>_>)begin.current,
             other->entries + other->num_slots_minus_one + (long)other->max_lookups);
  return;
}

Assistant:

sherwood_v3_table(const sherwood_v3_table & other, const ArgumentAlloc & alloc)
        : EntryAlloc(alloc), Hasher(other), Equal(other), _max_load_factor(other._max_load_factor)
    {
        rehash_for_other_container(other);
        try
        {
            insert(other.begin(), other.end());
        }
        catch(...)
        {
            clear();
            deallocate_data(entries, num_slots_minus_one, max_lookups);
            throw;
        }
    }